

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O3

CTPNStm * __thiscall CTcParser::parse_switch(CTcParser *this,int *err)

{
  undefined1 *puVar1;
  CTPNStmEnclosing *pCVar2;
  bool bVar3;
  bool bVar4;
  tc_toktyp_t tVar5;
  CTPNStmSwitch *enclosing_switch;
  CTcPrsNode *pCVar6;
  CTPNStmComp *pCVar7;
  
  enclosing_switch =
       (CTPNStmSwitch *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x58,(size_t)err);
  pCVar2 = this->enclosing_stm_;
  CTPNStmBase::CTPNStmBase((CTPNStmBase *)enclosing_switch);
  (enclosing_switch->super_CTPNStmSwitchBase).super_CTPNStmEnclosing.enclosing_ = pCVar2;
  (enclosing_switch->super_CTPNStmSwitchBase).expr_ = (CTcPrsNode *)0x0;
  (enclosing_switch->super_CTPNStmSwitchBase).body_ = (CTPNStm *)0x0;
  (enclosing_switch->super_CTPNStmSwitchBase).case_cnt_ = 0;
  puVar1 = &(enclosing_switch->super_CTPNStmSwitchBase).field_0x3c;
  *puVar1 = *puVar1 & 0xfe;
  (enclosing_switch->super_CTPNStmSwitchBase).super_CTPNStmEnclosing.super_CTPNStm.super_CTPNStmBase
  .super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_0031afa0
  ;
  enclosing_switch->case_slot_ofs_ = 0;
  enclosing_switch->default_slot_ofs_ = 0;
  tVar5 = CTcTokenizer::next(G_tok);
  if (tVar5 == TOKT_LPAR) {
    CTcTokenizer::next(G_tok);
  }
  else {
    CTcTokenizer::log_error_curtok(G_tok,0x2b45);
  }
  pCVar6 = parse_expr(this);
  if (pCVar6 == (CTcPrsNode *)0x0) {
    *err = 1;
  }
  else {
    (enclosing_switch->super_CTPNStmSwitchBase).expr_ = pCVar6;
    if ((G_tok->curtok_).typ_ == TOKT_RPAR) {
      CTcTokenizer::next(G_tok);
    }
    else {
      CTcTokenizer::log_error_curtok(G_tok,0x2b46);
    }
    if ((G_tok->curtok_).typ_ == TOKT_LBRACE) {
      CTcTokenizer::next(G_tok);
    }
    else {
      CTcTokenizer::log_error_curtok(G_tok,0x2b47);
    }
    bVar3 = false;
    do {
      tVar5 = (G_tok->curtok_).typ_;
      if ((tVar5 - TOKT_CASE < 2) || (tVar5 == TOKT_RBRACE)) {
        pCVar2 = this->enclosing_stm_;
        this->enclosing_stm_ = (CTPNStmEnclosing *)enclosing_switch;
        pCVar7 = parse_compound(this,err,0,1,enclosing_switch,0);
        this->enclosing_stm_ = pCVar2;
        if (*err != 0) {
          return (CTPNStm *)(CTPNStmSwitch *)0x0;
        }
        (enclosing_switch->super_CTPNStmSwitchBase).body_ = (CTPNStm *)pCVar7;
        return (CTPNStm *)enclosing_switch;
      }
      if (tVar5 == TOKT_EOF) {
        CTcTokenizer::log_error(0x2b49);
        *err = 1;
        return (CTPNStm *)(CTPNStmSwitch *)0x0;
      }
      bVar4 = !bVar3;
      bVar3 = true;
      if ((bVar4) && (bVar3 = false, (G_prs->field_0xec & 4) == 0)) {
        CTcTokenizer::log_error(0x2b48);
        bVar3 = true;
      }
      parse_stm(this,err,enclosing_switch,0);
    } while (*err == 0);
  }
  return (CTPNStm *)(CTPNStmSwitch *)0x0;
}

Assistant:

CTPNStm *CTcParser::parse_switch(int *err)
{
    CTcPrsNode *expr;
    CTPNStmSwitch *switch_stm;
    CTPNStm *body_stm;
    int skip;
    int unreachable_error_shown;
    CTPNStmEnclosing *old_enclosing;
    
    /* create the switch statement object */
    switch_stm = new CTPNStmSwitch(enclosing_stm_);

    /* skip the 'switch' and check for the left paren */
    if (G_tok->next() == TOKT_LPAR)
    {
        /* skip the left paren */
        G_tok->next();
    }
    else
    {
        /* log an error, and assume the paren is simply missing */
        G_tok->log_error_curtok(TCERR_REQ_SWITCH_LPAR);
    }

    /* parse the controlling expression */
    expr = parse_expr();
    if (expr == 0)
    {
        *err = TRUE;
        return 0;
    }

    /* set expression in the switch statement node */
    switch_stm->set_expr(expr);

    /* check for and skip the close paren */
    if (G_tok->cur() == TOKT_RPAR)
    {
        /* the right paren is present - skip it */
        G_tok->next();
    }
    else
    {
        /* log an error, and keep going from here */
        G_tok->log_error_curtok(TCERR_REQ_SWITCH_RPAR);
    }

    /* check for and skip the brace */
    if (G_tok->cur() == TOKT_LBRACE)
    {
        /* it's there - skip it */
        G_tok->next();
    }
    else
    {
        /* 
         *   log an error, and keep going on the assumption that the brace
         *   is simply missing but the switch body is otherwise correct 
         */
        G_tok->log_error_curtok(TCERR_REQ_SWITCH_LBRACE);
    }

    /* 
     *   The first thing in the switch body must be a 'case', 'default',
     *   or closing brace.  Other statements preceding the first 'case' or
     *   'default' label within the switch body are not allowed, because
     *   they would be unreachable.  Keep skipping statements until we get
     *   to one of these.  
     */
    for (skip = TRUE, unreachable_error_shown = FALSE ; skip ; )
    {
        /* see what we have */
        switch(G_tok->cur())
        {
        case TOKT_CASE:
        case TOKT_DEFAULT:
        case TOKT_RBRACE:
            /* this is what we're looking for */
            skip = FALSE;
            break;

        case TOKT_EOF:
            /* end of file within the switch - log an error */
            G_tok->log_error(TCERR_EOF_IN_SWITCH);

            /* return failure */
            *err = TRUE;
            return 0;

        default:
            /* 
             *   for anything else, log an error explaining that the code
             *   is unreachable - do this only once, no matter how many
             *   unreachable statements precede the first case label 
             */
            if (!unreachable_error_shown && !G_prs->get_syntax_only())
            {
                /* show the error */
                G_tok->log_error(TCERR_UNREACHABLE_CODE_IN_SWITCH);
                
                /* 
                 *   note that we've shown the error, so we don't show it
                 *   again if more unreachable statements follow
                 */
                unreachable_error_shown = TRUE;
            }

            /* parse (and ignore) this statement */
            parse_stm(err, switch_stm, FALSE);
            if (*err != 0)
                return 0;

            /* keep looking for the first label */
            break;
        }
    }

    /* the 'switch' is the enclosing statement for children */
    old_enclosing = set_enclosing_stm(switch_stm);

    /* parse the switch body */
    body_stm = parse_compound(err, FALSE, TRUE, switch_stm, FALSE);

    /* restore the enclosing statement */
    set_enclosing_stm(old_enclosing);

    /* if we failed to parse the compound statement, give up */
    if (*err)
        return 0;

    /* connect the switch to its body */
    switch_stm->set_body(body_stm);

    /* return the switch statement node */
    return switch_stm;
}